

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O2

bool __thiscall
Rml::DecoratorNinePatch::Initialise
          (DecoratorNinePatch *this,Rectanglef *_rect_outer,Rectanglef *_rect_inner,
          Array<NumericValue,_4> *_edges,Texture _texture,float _display_scale)

{
  Vector2Type VVar1;
  NumericValue NVar2;
  NumericValue NVar3;
  NumericValue NVar4;
  int iVar5;
  array<Rml::NumericValue,_4UL> *in_RAX;
  pointer __p;
  pointer __p_00;
  _Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false> local_28;
  
  VVar1 = _rect_outer->p1;
  (this->rect_outer).p0 = _rect_outer->p0;
  (this->rect_outer).p1 = VVar1;
  VVar1 = _rect_inner->p1;
  (this->rect_inner).p0 = _rect_inner->p0;
  (this->rect_inner).p1 = VVar1;
  this->display_scale = _display_scale;
  local_28._M_head_impl = in_RAX;
  if (_edges != (Array<NumericValue,_4> *)0x0) {
    __p_00 = (pointer)operator_new(0x20);
    NVar2 = _edges->_M_elems[1];
    NVar3 = _edges->_M_elems[2];
    NVar4 = _edges->_M_elems[3];
    __p_00->_M_elems[0] = _edges->_M_elems[0];
    __p_00->_M_elems[1] = NVar2;
    __p_00->_M_elems[2] = NVar3;
    __p_00->_M_elems[3] = NVar4;
    local_28._M_head_impl = (array<Rml::NumericValue,_4UL> *)0x0;
    ::std::
    __uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
    ::reset((__uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
             *)&this->edges,__p_00);
    ::std::
    unique_ptr<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
    ::~unique_ptr((unique_ptr<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                   *)&local_28);
  }
  iVar5 = Decorator::AddTexture(&this->super_Decorator,_texture);
  return -1 < iVar5;
}

Assistant:

bool DecoratorNinePatch::Initialise(const Rectanglef& _rect_outer, const Rectanglef& _rect_inner, const Array<NumericValue, 4>* _edges,
	Texture _texture, float _display_scale)
{
	rect_outer = _rect_outer;
	rect_inner = _rect_inner;

	display_scale = _display_scale;

	if (_edges)
		edges = MakeUnique<Array<NumericValue, 4>>(*_edges);

	int texture_index = AddTexture(_texture);
	return (texture_index >= 0);
}